

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oid.c
# Opt level: O1

int mbedtls_oid_get_numeric_string(char *buf,size_t size,mbedtls_asn1_buf *oid)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  size_t __maxlen;
  ulong uVar4;
  bool bVar5;
  
  __maxlen = size;
  if (oid->len != 0) {
    bVar1 = *oid->p;
    uVar2 = snprintf(buf,size,"%d.%d",(ulong)bVar1 / 0x28,
                     (ulong)((uint)bVar1 + (bVar1 / 0x28) * -0x28));
    if ((int)uVar2 < 0) {
      return -0xb;
    }
    uVar4 = (ulong)uVar2;
    if (size < uVar4 || size - uVar4 == 0) {
      return -0xb;
    }
    buf = buf + uVar4;
    __maxlen = size - uVar4;
  }
  if (1 < oid->len) {
    uVar4 = 1;
    uVar2 = 0;
    do {
      if (0x1ffffff < uVar2) {
        return -0xb;
      }
      uVar2 = oid->p[uVar4] & 0x7f | uVar2 << 7;
      if (-1 < (char)oid->p[uVar4]) {
        uVar2 = snprintf(buf,__maxlen,".%d");
        if ((int)uVar2 < 0) {
          return -0xb;
        }
        uVar3 = (ulong)uVar2;
        bVar5 = __maxlen < uVar3;
        __maxlen = __maxlen - uVar3;
        if (bVar5 || __maxlen == 0) {
          return -0xb;
        }
        buf = buf + uVar3;
        uVar2 = 0;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < oid->len);
  }
  return (int)size - (int)__maxlen;
}

Assistant:

int mbedtls_oid_get_numeric_string( char *buf, size_t size,
                            const mbedtls_asn1_buf *oid )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i, n;
    unsigned int value;
    char *p;

    p = buf;
    n = size;

    /* First byte contains first two dots */
    if( oid->len > 0 )
    {
        ret = mbedtls_snprintf( p, n, "%d.%d", oid->p[0] / 40, oid->p[0] % 40 );
        OID_SAFE_SNPRINTF;
    }

    value = 0;
    for( i = 1; i < oid->len; i++ )
    {
        /* Prevent overflow in value. */
        if( ( ( value << 7 ) >> 7 ) != value )
            return( MBEDTLS_ERR_OID_BUF_TOO_SMALL );

        value <<= 7;
        value += oid->p[i] & 0x7F;

        if( !( oid->p[i] & 0x80 ) )
        {
            /* Last byte */
            ret = mbedtls_snprintf( p, n, ".%d", value );
            OID_SAFE_SNPRINTF;
            value = 0;
        }
    }

    return( (int) ( size - n ) );
}